

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int patchtestreg(FuncState *fs,int node,int reg)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  
  puVar1 = fs->f->code + node;
  if (0 < node) {
    uVar2 = puVar1[-1];
    if ((char)luaP_opmodes[uVar2 & 0xff] < '\0') {
      puVar1 = puVar1 + -1;
      goto LAB_00147091;
    }
  }
  uVar2 = *puVar1;
LAB_00147091:
  iVar3 = 0;
  if ((char)uVar2 == '#') {
    if ((reg == 0x7f) || (uVar2 >> 0x18 == reg)) {
      iVar3 = 1;
      *puVar1 = uVar2 & 0xff0022 | uVar2 >> 0x10 & 0xff00;
      if (((byte)ravi_parser_debug & 2) != 0) {
        raviY_printf(fs,"[?]* %o ; generate OP_TEST\n");
      }
    }
    else {
      iVar3 = 1;
      *(byte *)((long)puVar1 + 1) = (byte)reg & 0x7f;
      if (((byte)ravi_parser_debug & 2) != 0) {
        raviY_printf(fs,"[?]* %o ; set A to %d\n",(ulong)*puVar1);
      }
    }
  }
  return iVar3;
}

Assistant:

static int patchtestreg (FuncState *fs, int node, int reg) {
  Instruction *i = getjumpcontrol(fs, node);
  if (GET_OPCODE(*i) != OP_TESTSET)
    return 0;  /* cannot patch other instructions */
  if (reg != NO_REG && reg != GETARG_B(*i)) {
    SETARG_A(*i, reg);
    DEBUG_CODEGEN(raviY_printf(fs, "[?]* %o ; set A to %d\n", *i, reg));
  }
  else {
     /* no register to put value or register already has the value;
        change instruction to simple test */
    *i = CREATE_ABC(OP_TEST, GETARG_B(*i), 0, GETARG_C(*i));
    DEBUG_CODEGEN(raviY_printf(fs, "[?]* %o ; generate OP_TEST\n", *i));
  }
  return 1;
}